

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get<tinyusdz::value::texcoord2d>
          (Attribute *this,double t,texcoord2d *dst,TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  value_type *pvVar2;
  optional<tinyusdz::value::texcoord2d> local_68;
  undefined1 local_50 [8];
  optional<tinyusdz::value::texcoord2d> v;
  TimeSampleInterpolationType tinterp_local;
  texcoord2d *dst_local;
  double t_local;
  Attribute *this_local;
  
  if (dst == (texcoord2d *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    tinyusdz::value::TimeCode::TimeCode((TimeCode *)((long)&v.contained + 8),t);
    bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)((long)&v.contained + 8));
    if ((bVar1) && (bVar1 = has_value(this), bVar1)) {
      primvar::PrimVar::get_value<tinyusdz::value::texcoord2d>(&local_68,&this->_var);
      nonstd::optional_lite::optional<tinyusdz::value::texcoord2d>::
      optional<tinyusdz::value::texcoord2d,_0>
                ((optional<tinyusdz::value::texcoord2d> *)local_50,&local_68);
      nonstd::optional_lite::optional<tinyusdz::value::texcoord2d>::~optional(&local_68);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_50);
      if (bVar1) {
        pvVar2 = nonstd::optional_lite::optional<tinyusdz::value::texcoord2d>::value
                           ((optional<tinyusdz::value::texcoord2d> *)local_50);
        dst->s = pvVar2->s;
        dst->t = pvVar2->t;
        this_local._7_1_ = 1;
      }
      nonstd::optional_lite::optional<tinyusdz::value::texcoord2d>::~optional
                ((optional<tinyusdz::value::texcoord2d> *)local_50);
      if (bVar1) goto LAB_002f65d0;
    }
    bVar1 = has_timesamples(this);
    if (bVar1) {
      this_local._7_1_ =
           primvar::PrimVar::get_interpolated_value<tinyusdz::value::texcoord2d>
                     (&this->_var,t,tinterp,dst);
    }
    else {
      this_local._7_1_ = get_value<tinyusdz::value::texcoord2d>(this,dst);
    }
  }
LAB_002f65d0:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }